

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall POMDPFormatParsing::ParserPOMDPFormat_Spirit::Parse(ParserPOMDPFormat_Spirit *this)

{
  bool_type bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  E *this_00;
  ostream *poVar4;
  ParserPOMDPFormat_Spirit *in_RDI;
  E *e;
  string unparsed;
  Index i;
  iterator_t st2;
  iterator_t st;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  info;
  CommentBlankorNewLineParser skip_parser;
  POMDPFileParser pomdpfp;
  iterator_t last;
  iterator_t first;
  iterator_t_fi last_fi;
  stringstream ss;
  iterator_t_fi first_fi;
  char *pf_c;
  string pf;
  ParserPOMDPFormat_Spirit *in_stack_fffffffffffff848;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  *in_stack_fffffffffffff850;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff858;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  *in_stack_fffffffffffff860;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff868;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff870;
  parser<boost::spirit::classic::sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::optional<boost::spirit::classic::end_parser>_>_>
  *in_stack_fffffffffffff878;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff880;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff888;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
  *in_stack_fffffffffffff8a0;
  type_conflict4 local_749;
  char *in_stack_fffffffffffff8b8;
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
  *in_stack_fffffffffffff8c0;
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
  *in_stack_fffffffffffff8c8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff8d0;
  allocator<char> local_6f1 [57];
  allocator<char> *in_stack_fffffffffffff948;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff950;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  string local_620 [140];
  uint local_594;
  sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::optional<boost::spirit::classic::end_parser>_>
  *local_4b8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_3c8;
  byte local_360;
  byte local_35f;
  ulong local_358;
  stringstream local_208 [16];
  ostream local_1f8 [399];
  allocator<char> local_69;
  string local_68 [56];
  undefined8 local_30;
  string local_28 [40];
  
  GetPOMDPDiscrete(in_RDI);
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            ((MultiAgentDecisionProcess *)in_stack_fffffffffffff848);
  local_30 = std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
             (allocator<char> *)in_stack_fffffffffffff880);
  boost::spirit::classic::
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
  file_iterator(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = boost::spirit::classic::safe_bool::operator_cast_to__
                    ((safe_bool<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::impl::no_base<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>_>_>
                      *)0xa42ef3);
  if (bVar1 == 0xffffffffffffffff) {
    std::__cxx11::stringstream::stringstream(local_208);
    poVar2 = std::operator<<(local_1f8,"Unable to open file: ");
    poVar2 = std::operator<<(poVar2,local_28);
    std::operator<<(poVar2," !\n");
    uVar3 = __cxa_allocate_exception(0x28);
    E::E((E *)in_stack_fffffffffffff850,(stringstream *)in_stack_fffffffffffff848);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  boost::spirit::classic::
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::make_end
            ((file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
              *)in_stack_fffffffffffff868);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
  ::position_iterator<char_const*>
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
             in_stack_fffffffffffff8b8);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff890);
  POMDPFileParser::POMDPFileParser
            ((POMDPFileParser *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  comment_cbonlp::CommentBlankorNewLineParser::CommentBlankorNewLineParser
            ((CommentBlankorNewLineParser *)in_stack_fffffffffffff880);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff890);
  boost::spirit::classic::
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  ::parse_info(in_stack_fffffffffffff860,in_stack_fffffffffffff858,
               SUB81((ulong)in_stack_fffffffffffff850 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff850 >> 0x30,0),(size_t)in_stack_fffffffffffff848);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&in_stack_fffffffffffff850->stop);
  boost::spirit::classic::operator!
            ((parser<boost::spirit::classic::end_parser> *)in_stack_fffffffffffff848);
  local_4b8 = boost::spirit::classic::operator>>
                        ((parser<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser> *)
                         in_stack_fffffffffffff850,
                         (parser<boost::spirit::classic::optional<boost::spirit::classic::end_parser>_>
                          *)in_stack_fffffffffffff848);
  boost::spirit::classic::
  parse<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::optional<boost::spirit::classic::end_parser>>,comment_cbonlp::CommentBlankorNewLineParser>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             (parser<comment_cbonlp::CommentBlankorNewLineParser> *)in_stack_fffffffffffff870);
  boost::spirit::classic::
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  ::operator=(in_stack_fffffffffffff850,
              (parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
               *)in_stack_fffffffffffff848);
  boost::spirit::classic::
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  ::~parse_info((parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
                 *)0xa43191);
  if ((local_35f & 1) != 0) {
    boost::spirit::classic::
    parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
    ::~parse_info((parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
                   *)0xa43649);
    POMDPFileParser::~POMDPFileParser((POMDPFileParser *)0xa43656);
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&in_stack_fffffffffffff850->stop);
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&in_stack_fffffffffffff850->stop);
    boost::spirit::classic::
    file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
    ~file_iterator((file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                    *)0xa4367d);
    boost::spirit::classic::
    file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
    ~file_iterator((file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                    *)0xa4368a);
    std::__cxx11::string::~string(local_28);
    return;
  }
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_594 = 1;
  while( true ) {
    local_749 = false;
    if (local_594 < 200) {
      local_749 = boost::operator!=((iterator_facade<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_const_char,_boost::forward_traversal_tag,_const_char_&,_long>
                                     *)in_stack_fffffffffffff850,
                                    (iterator_facade<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_const_char,_boost::forward_traversal_tag,_const_char_&,_long>
                                     *)in_stack_fffffffffffff848);
    }
    if (local_749 == false) break;
    boost::operator++((iterator_facade<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_const_char,_boost::forward_traversal_tag,_const_char_&,_long>
                       *)in_stack_fffffffffffff868,(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&in_stack_fffffffffffff850->stop);
    local_594 = local_594 + 1;
  }
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
             in_stack_fffffffffffff948);
  std::allocator<char>::~allocator(local_6f1);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&in_stack_fffffffffffff850->stop);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&in_stack_fffffffffffff850->stop);
  std::operator<<((ostream *)&std::cout,"stopped at: ");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(&local_3c8);
  poVar2 = POMDPFormatParsing::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (file_position *)in_stack_fffffffffffff848);
  poVar2 = std::operator<<(poVar2,"-> unparsed : ");
  this_00 = (E *)std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<((ostream *)this_00,local_620);
  std::operator<<(poVar2,"\"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"partial match? hit: \"");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_360 & 1));
  std::operator<<(poVar4,"\"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"consumed chars - length: \"");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_358);
  std::operator<<(poVar4,"\"\n");
  uVar3 = __cxa_allocate_exception(0x28);
  E::E(this_00,(char *)poVar2);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::Parse()
{
    string pf = GetPOMDPDiscrete()->GetProblemFile();
    const char* pf_c = pf.c_str();
    // Create a file iterator for this file
    iterator_t_fi first_fi(pf_c);
    if (!first_fi)
    {
        stringstream ss; ss << "Unable to open file: "<<pf<<" !\n";
        throw E(ss);
    }
    iterator_t_fi last_fi = first_fi.make_end();// Create an EOF iterator

    iterator_t first( first_fi, last_fi, pf_c );
    iterator_t last;

    POMDPFileParser pomdpfp(this);
    comment_cbonlp::CommentBlankorNewLineParser skip_parser;
    parse_info<iterator_t> info; 
    // Parse
    try{
        // Spirit changed when upgrading from 1.33.1 to 1.34.0:
        // trailing spaces are no longer accepted, which the next line
        // to fail on some problems (those with trailing comments). Adding
        // ">> !end_p" to the grammar works around this problem.
        info = parse(first, last , pomdpfp >> !end_p, skip_parser);
        if (info.full)
        {
            if(DEBUG_POMDP_PARSE) cout << ">>>Parsing succeeded\n";
        }
        else
        {
            iterator_t st = info.stop;
            iterator_t st2 = info.stop;
            for(Index i=1;i<200 && st2 != last ;i++)st2++;
            string unparsed(st, st2);
            cout << "stopped at: " << info.stop.get_position() 
                << "-> unparsed : "<< "\"" << unparsed << "\"\n";
            cout << "partial match? hit: \"" << info.hit << "\"\n";
            cout << "consumed chars - length: \"" << info.length << "\"\n";
            throw E("Parsing failed");
        }
    }    
    catch(E& e)
    {
        e.Print();
    }

    if(DEBUG_POMDP_PARSE)  cout << "-------------------------\n";
    return;
}